

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int unixMapfile(unixFile *pFd,i64 nByte)

{
  int iVar1;
  undefined1 local_c0 [8];
  stat statbuf;
  __dev_t _Stack_28;
  int rc;
  i64 nMap;
  i64 nByte_local;
  unixFile *pFd_local;
  
  if (pFd->nFetchOut < 1) {
    _Stack_28 = nByte;
    if (nByte < 0) {
      iVar1 = (*aSyscall[5].pCurrent)((ulong)(uint)pFd->h,local_c0);
      if (iVar1 != 0) {
        return 0x70a;
      }
      _Stack_28 = statbuf.st_rdev;
      statbuf.__glibc_reserved[2]._4_4_ = 0;
    }
    if (pFd->mmapSizeMax < (long)_Stack_28) {
      _Stack_28 = pFd->mmapSizeMax;
    }
    if (_Stack_28 != pFd->mmapSize) {
      if ((long)_Stack_28 < 1) {
        unixUnmapfile(pFd);
      }
      else {
        unixRemapfile(pFd,_Stack_28);
      }
    }
  }
  return 0;
}

Assistant:

static int unixMapfile(unixFile *pFd, i64 nByte){
#if SQLITE_MAX_MMAP_SIZE>0
  i64 nMap = nByte;
  int rc;

  assert( nMap>=0 || pFd->nFetchOut==0 );
  if( pFd->nFetchOut>0 ) return SQLITE_OK;

  if( nMap<0 ){
    struct stat statbuf;          /* Low-level file information */
    rc = osFstat(pFd->h, &statbuf);
    if( rc!=SQLITE_OK ){
      return SQLITE_IOERR_FSTAT;
    }
    nMap = statbuf.st_size;
  }
  if( nMap>pFd->mmapSizeMax ){
    nMap = pFd->mmapSizeMax;
  }

  if( nMap!=pFd->mmapSize ){
    if( nMap>0 ){
      unixRemapfile(pFd, nMap);
    }else{
      unixUnmapfile(pFd);
    }
  }
#endif

  return SQLITE_OK;
}